

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O1

string_view RenX::getTeamName(TeamType team)

{
  undefined **ppuVar1;
  size_t *psVar2;
  string_view sVar3;
  
  if (team == GDI) {
    ppuVar1 = (undefined **)&_ZL12GDIShortName_1;
    psVar2 = &_ZL12GDIShortName_0;
  }
  else if (team == Nod) {
    ppuVar1 = (undefined **)&_ZL12NodShortName_1;
    psVar2 = &_ZL12NodShortName_0;
  }
  else {
    ppuVar1 = &_ZL14OtherShortName_1;
    psVar2 = &_ZL14OtherShortName_0;
  }
  sVar3._M_str = *ppuVar1;
  sVar3._M_len = *psVar2;
  return sVar3;
}

Assistant:

std::string_view RenX::getTeamName(TeamType team)
{
	switch (team)
	{
	case RenX::TeamType::GDI:
		return GDIShortName;
	case RenX::TeamType::Nod:
		return NodShortName;
	default:
		return OtherShortName;
	}
}